

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjSaveImage(char *filename,uchar *buffer,int width,int pitch,int height,int pixelFormat,
               int flags)

{
  int iVar1;
  char *pcVar2;
  tjhandle handle;
  FILE *__stream;
  int *piVar3;
  char *pcVar4;
  djpeg_dest_ptr pdVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  j_decompress_ptr cinfo;
  
  if ((0xb < (uint)pixelFormat || height < 1) ||
      ((pitch < 0 || width < 1) || (buffer == (uchar *)0x0 || filename == (char *)0x0))) {
    pcVar2 = (char *)__tls_get_addr(&PTR_0019ef20);
    builtin_strncpy(pcVar2,"tjSaveImage(): Invalid argument",0x20);
    return -1;
  }
  handle = tjInitDecompress();
  if (handle == (tjhandle)0x0) {
    return -1;
  }
  __stream = fopen(filename,"wb");
  if (__stream == (FILE *)0x0) {
    pcVar2 = (char *)__tls_get_addr(&PTR_0019ef20);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    snprintf(pcVar2,200,"%s\n%s","tjSaveImage(): Cannot open output file",pcVar4);
    tjDestroy(handle);
    return -1;
  }
  iVar1 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
  if (iVar1 != 0) {
    iVar1 = -1;
    goto LAB_0013c484;
  }
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  *(J_COLOR_SPACE *)((long)handle + 0x248) = pf2cs[(uint)pixelFormat];
  *(int *)((long)handle + 0x238) = width;
  *(int *)((long)handle + 0x23c) = height;
  *(undefined4 *)((long)handle + 0x22c) = 0xca;
  *(undefined8 *)((long)handle + 0x24c) = 0x100000001;
  pcVar2 = strrchr(filename,0x2e);
  if ((pcVar2 == (char *)0x0) || (iVar1 = strcasecmp(pcVar2,".bmp"), iVar1 != 0)) {
    pdVar5 = jinit_write_ppm(cinfo);
    if (pdVar5 == (djpeg_dest_ptr)0x0) {
      pcVar2 = (char *)__tls_get_addr(&PTR_0019ef20);
      builtin_strncpy(pcVar2,"tjSaveImage(): Could not initialize PPM writer",0x2f);
      goto LAB_0013c47f;
    }
    uVar6 = (uint)flags >> 1 & 1;
  }
  else {
    pdVar5 = jinit_write_bmp(cinfo,0,0);
    if (pdVar5 == (djpeg_dest_ptr)0x0) {
      pcVar2 = (char *)__tls_get_addr(&PTR_0019ef20);
      builtin_strncpy(pcVar2,"tjSaveImage(): Could not initialize bitmap writer",0x32);
LAB_0013c47f:
      iVar1 = -1;
      goto LAB_0013c484;
    }
    uVar6 = (uint)((flags & 2U) == 0);
  }
  pdVar5->output_file = (FILE *)__stream;
  (*pdVar5->start_output)(cinfo,pdVar5);
  (**(code **)(*(long *)((long)handle + 0x210) + 0x30))(cinfo);
  if (pitch == 0) {
    pitch = tjPixelSize[(uint)pixelFormat] * width;
  }
  uVar8 = *(uint *)((long)handle + 0x2b0);
  if (uVar8 < *(uint *)((long)handle + 0x294)) {
    iVar1 = tjPixelSize[(uint)pixelFormat];
    do {
      uVar7 = ~uVar8 + height;
      if (uVar6 == 0) {
        uVar7 = uVar8;
      }
      memcpy(*pdVar5->buffer,buffer + uVar7 * pitch,(long)width * (long)iVar1);
      (*pdVar5->put_pixel_rows)(cinfo,pdVar5,1);
      uVar8 = *(int *)((long)handle + 0x2b0) + 1;
      *(uint *)((long)handle + 0x2b0) = uVar8;
    } while (uVar8 < *(uint *)((long)handle + 0x294));
  }
  (*pdVar5->finish_output)(cinfo,pdVar5);
  iVar1 = 0;
LAB_0013c484:
  tjDestroy(handle);
  fclose(__stream);
  return iVar1;
}

Assistant:

DLLEXPORT int tjSaveImage(const char *filename, unsigned char *buffer,
                          int width, int pitch, int height, int pixelFormat,
                          int flags)
{
  int retval = 0;
  tjhandle handle = NULL;
  tjinstance *this;
  j_decompress_ptr dinfo = NULL;
  djpeg_dest_ptr dst;
  FILE *file = NULL;
  char *ptr = NULL;
  boolean invert;

  if (!filename || !buffer || width < 1 || pitch < 0 || height < 1 ||
      pixelFormat < 0 || pixelFormat >= TJ_NUMPF)
    THROWG("tjSaveImage(): Invalid argument");

  if ((handle = tjInitDecompress()) == NULL)
    return -1;
  this = (tjinstance *)handle;
  dinfo = &this->dinfo;

  if ((file = fopen(filename, "wb")) == NULL)
    THROW_UNIX("tjSaveImage(): Cannot open output file");

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  this->dinfo.out_color_space = pf2cs[pixelFormat];
  dinfo->image_width = width;  dinfo->image_height = height;
  dinfo->global_state = DSTATE_READY;
  dinfo->scale_num = dinfo->scale_denom = 1;

  ptr = strrchr(filename, '.');
  if (ptr && !strcasecmp(ptr, ".bmp")) {
    if ((dst = jinit_write_bmp(dinfo, FALSE, FALSE)) == NULL)
      THROWG("tjSaveImage(): Could not initialize bitmap writer");
    invert = (flags & TJFLAG_BOTTOMUP) == 0;
  } else {
    if ((dst = jinit_write_ppm(dinfo)) == NULL)
      THROWG("tjSaveImage(): Could not initialize PPM writer");
    invert = (flags & TJFLAG_BOTTOMUP) != 0;
  }

  dst->output_file = file;
  (*dst->start_output) (dinfo, dst);
  (*dinfo->mem->realize_virt_arrays) ((j_common_ptr)dinfo);

  if (pitch == 0) pitch = width * tjPixelSize[pixelFormat];

  while (dinfo->output_scanline < dinfo->output_height) {
    unsigned char *rowptr;

    if (invert)
      rowptr = &buffer[(height - dinfo->output_scanline - 1) * pitch];
    else
      rowptr = &buffer[dinfo->output_scanline * pitch];
    memcpy(dst->buffer[0], rowptr, width * tjPixelSize[pixelFormat]);
    (*dst->put_pixel_rows) (dinfo, dst, 1);
    dinfo->output_scanline++;
  }

  (*dst->finish_output) (dinfo, dst);

bailout:
  if (handle) tjDestroy(handle);
  if (file) fclose(file);
  return retval;
}